

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

PMNDX_PACKAGE __thiscall
TRootHandler_MNDX::FindMndxPackage(TRootHandler_MNDX *this,char *szFileName)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  PMNDX_PACKAGE p_Var4;
  size_t i;
  ulong ItemIndex;
  PMNDX_PACKAGE p_Var5;
  ulong uVar6;
  
  sVar2 = strlen(szFileName);
  uVar3 = (this->Packages).m_ItemCount;
  if (uVar3 == 0) {
    __assert_fail("Packages.ItemCount() != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_MNDX.cpp"
                  ,0xa82,"PMNDX_PACKAGE TRootHandler_MNDX::FindMndxPackage(const char *)");
  }
  uVar6 = 0;
  p_Var5 = (PMNDX_PACKAGE)0x0;
  for (ItemIndex = 0; ItemIndex < uVar3; ItemIndex = ItemIndex + 1) {
    p_Var4 = (PMNDX_PACKAGE)CASC_ARRAY::ItemAt(&this->Packages,ItemIndex);
    uVar3 = p_Var4->nLength;
    if (((uVar3 < sVar2) && (uVar6 < uVar3)) &&
       (iVar1 = strncmp(szFileName,p_Var4->szFileName,uVar3), iVar1 == 0)) {
      p_Var5 = p_Var4;
      uVar6 = uVar3;
    }
    uVar3 = (this->Packages).m_ItemCount;
  }
  return p_Var5;
}

Assistant:

PMNDX_PACKAGE FindMndxPackage(const char * szFileName)
    {
        PMNDX_PACKAGE pMatching = NULL;
        size_t nMaxLength = 0;
        size_t nLength = strlen(szFileName);

        // Packages must be loaded
        assert(Packages.ItemCount() != 0);

        //FILE * fp = fopen("E:\\packages.txt", "wt");
        //for(size_t i = 0; i < hs->pPackages->NameEntries; i++, pPackage++)
        //{
        //    if(pPackage->szFileName != NULL)
        //        fprintf(fp, "%s\n", pPackage->szFileName);
        //}
        //fclose(fp);

        // Find the longest matching name
        for(size_t i = 0; i < Packages.ItemCount(); i++)
        {
            PMNDX_PACKAGE pPackage = (PMNDX_PACKAGE)Packages.ItemAt(i);

            if(pPackage->nLength < nLength && pPackage->nLength > nMaxLength)
            {
                // Compare the package name
                if(!strncmp(szFileName, pPackage->szFileName, pPackage->nLength))
                {
                    nMaxLength = pPackage->nLength;
                    pMatching = pPackage;
                }
            }
        }

        // Give the package pointer or NULL if not found
        return pMatching;
    }